

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.hh
# Opt level: O0

void __thiscall
tchecker::
join_iterator_t<tchecker::range_t<boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>,_boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>_>,_tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_>
::advance_while_empty_range
          (join_iterator_t<tchecker::range_t<boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>,_boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>_>,_tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_>
           *this)

{
  type_conflict2 tVar1;
  bool bVar2;
  const_iterator local_50;
  const_iterator local_48;
  asynchronous_edges_const_iterator_t local_40 [2];
  range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>
  local_30;
  range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>
  local_20;
  join_iterator_t<tchecker::range_t<boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>,_boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>_>,_tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_>
  *local_10;
  join_iterator_t<tchecker::range_t<boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>,_boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>_>,_tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_>
  *this_local;
  
  local_10 = this;
  while (tVar1 = boost::iterators::operator!=
                           ((iterator_facade<boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>,_tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>,_boost::iterators::random_access_traversal_tag,_tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>,_long>
                             *)this,(iterator_facade<boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>,_tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>,_boost::iterators::random_access_traversal_tag,_tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>,_long>
                                     *)&this->_end), tVar1) {
    local_30 = std::
               function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(const_boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>_&)>
               ::operator()(&this->_get_sub_range,&this->_it);
    range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>
    ::iterators(&local_20);
    std::
    tie<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>
              (local_40,&this->_range_it);
    std::
    tuple<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t&,tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t&>
    ::operator=((tuple<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t&,tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t&>
                 *)local_40,
                (tuple<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>
                 *)&local_20);
    bVar2 = __gnu_cxx::operator!=
                      (&(this->_range_it).super_const_iterator,
                       &(this->_range_end).super_const_iterator);
    if (bVar2) break;
    boost::iterators::detail::
    iterator_facade_base<boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>,_tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>,_boost::iterators::random_access_traversal_tag,_tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>,_long,_false,_false>
    ::operator++((iterator_facade_base<boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>,_tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>,_boost::iterators::random_access_traversal_tag,_tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>,_long,_false,_false>
                  *)this);
  }
  tVar1 = boost::iterators::operator==
                    ((iterator_facade<boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>,_tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>,_boost::iterators::random_access_traversal_tag,_tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>,_long>
                      *)this,(iterator_facade<boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>,_tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>,_boost::iterators::random_access_traversal_tag,_tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>,_long>
                              *)&this->_end);
  if (tVar1) {
    memset(&local_48,0,8);
    syncprod::system_t::asynchronous_edges_const_iterator_t::asynchronous_edges_const_iterator_t
              ((asynchronous_edges_const_iterator_t *)&local_48);
    (this->_range_it).super_const_iterator._M_current = local_48._M_current;
    memset(&local_50,0,8);
    syncprod::system_t::asynchronous_edges_const_iterator_t::asynchronous_edges_const_iterator_t
              ((asynchronous_edges_const_iterator_t *)&local_50);
    (this->_range_end).super_const_iterator._M_current = local_50._M_current;
  }
  return;
}

Assistant:

void advance_while_empty_range()
  {
    // Find first non-empty range, if any
    while (_it != _end) {
      std::tie(_range_it, _range_end) = _get_sub_range(_it).iterators();
      if (_range_it != _range_end)
        break;
      ++_it;
    }
    if (_it == _end) {
      _range_it = typename SUBR::begin_iterator_t{};
      _range_end = typename SUBR::end_iterator_t{};
    }
  }